

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedIterations::Run(AdvancedIterations *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  undefined4 extraout_EAX;
  int iVar3;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  char *format;
  int i;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  IVec4 data;
  char *glsl_vs;
  IVec4 zero;
  undefined1 local_68 [16];
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_50 = 
  "#version 430 core\nin ivec4 vs_in_data;\nout StageData {\n  ivec4 data;\n} vs_out;\nvoid main() {\n  vs_out.data = vs_in_data + 1;\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar2 = glu::CallLogWrapper::glCreateProgram(this_00);
  this->m_po = GVar2;
  GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  uVar4 = 0;
  glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_50,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  glu::CallLogWrapper::glAttachShader(this_00,this->m_po,GVar2);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
  bVar1 = RelinkProgram(this,1);
  if (!bVar1) {
    return -1;
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_buffer[0]);
  local_48 = 0;
  uStack_40 = 0;
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x10,&local_48,0x88e4);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->m_buffer[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x10,&local_48,0x88e9);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,1,4,0x1404,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_buffer[0],0,0x10);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[1]);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,1,4,0x1404,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_buffer[1],0,0x10);
  glu::CallLogWrapper::glBindVertexArray(this_00,0);
  glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[0]);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_buffer[1]);
  glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[1]);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_buffer[0]);
  glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,0);
  glu::CallLogWrapper::glEnable(this_00,0x8c89);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_po);
  do {
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[uVar4 & 1]);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[uVar4 & 1]);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 10);
  local_68 = ZEXT816(0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->m_buffer[0]);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0x10,local_68);
  auVar5._0_4_ = -(uint)(local_68._0_4_ == 10);
  auVar5._4_4_ = -(uint)(local_68._4_4_ == 10);
  auVar5._8_4_ = -(uint)(local_68._8_4_ == 10);
  auVar5._12_4_ = -(uint)(local_68._12_4_ == 10);
  iVar3 = movmskps(extraout_EAX,auVar5);
  if (iVar3 == 0xf) {
    bVar1 = RelinkProgram(this,5);
    if (!bVar1) {
      return -1;
    }
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
    glu::CallLogWrapper::glDisableVertexAttribArray(this_00,1);
    uVar4 = 0;
    glu::CallLogWrapper::glBindVertexBuffer(this_00,1,0,0,0);
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,5,4,0x1404,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,5);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,5,this->m_buffer[0],0,0x10);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[1]);
    glu::CallLogWrapper::glDisableVertexAttribArray(this_00,1);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,1,0,0,0);
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,5,4,0x1404,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,5);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,7,this->m_buffer[1],0,0x10);
    glu::CallLogWrapper::glVertexAttribBinding(this_00,5,7);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    do {
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[uVar4 & 1]);
      glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[uVar4 & 1]);
      glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glEndTransformFeedback(this_00);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 10);
    local_68 = (undefined1  [16])0x0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->m_buffer[0]);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0x10,local_68);
    auVar6._0_4_ = -(uint)(local_68._0_4_ == 0x14);
    auVar6._4_4_ = -(uint)(local_68._4_4_ == 0x14);
    auVar6._8_4_ = -(uint)(local_68._8_4_ == 0x14);
    auVar6._12_4_ = -(uint)(local_68._12_4_ == 0x14);
    iVar3 = movmskps(extraout_EAX_00,auVar6);
    if (iVar3 != 0xf) {
      anon_unknown_0::Output
                ("Data is: %d %d %d %d, data should be: 20 20 20 20.\n",(ulong)(uint)local_68._0_4_,
                 local_68._4_4_,local_68._8_4_,local_68._12_4_);
      return -1;
    }
    bVar1 = RelinkProgram(this,0xb);
    if (!bVar1) {
      return -1;
    }
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,0);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
    glu::CallLogWrapper::glDisableVertexAttribArray(this_00,5);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,5,0,0,0);
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,0xb,4,0x1404,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xb);
    uVar4 = 1;
    do {
      glu::CallLogWrapper::glBindVertexBuffer(this_00,0xb,this->m_buffer[uVar4 - 1 & 1],0,0x10);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_buffer[uVar4 & 1]);
      glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glEndTransformFeedback(this_00);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0xb);
    local_68 = (undefined1  [16])0x0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->m_buffer[0]);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0x10,local_68);
    auVar7._0_4_ = -(uint)(local_68._0_4_ == 0x1e);
    auVar7._4_4_ = -(uint)(local_68._4_4_ == 0x1e);
    auVar7._8_4_ = -(uint)(local_68._8_4_ == 0x1e);
    auVar7._12_4_ = -(uint)(local_68._12_4_ == 0x1e);
    iVar3 = movmskps(extraout_EAX_01,auVar7);
    if (iVar3 == 0xf) {
      return 0;
    }
    format = "Data is: %d %d %d %d, data should be: 30 30 30 30.\n";
  }
  else {
    format = "Data is: %d %d %d %d, data should be: 10 10 10 10.\n";
  }
  anon_unknown_0::Output
            (format,(ulong)(uint)local_68._0_4_,local_68._4_4_,local_68._8_4_,local_68._12_4_);
  return -1;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 430 core" NL "in ivec4 vs_in_data;" NL "out StageData {" NL "  ivec4 data;" NL "} vs_out;" NL
			"void main() {" NL "  vs_out.data = vs_in_data + 1;" NL "}";

		m_po = glCreateProgram();
		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glCompileShader(sh);
			glAttachShader(m_po, sh);
			glDeleteShader(sh);
		}
		if (!RelinkProgram(1))
			return ERROR;

		glBindBuffer(GL_ARRAY_BUFFER, m_buffer[0]);
		IVec4 zero(0);
		glBufferData(GL_ARRAY_BUFFER, 16, &zero, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffer[1]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, &zero, GL_DYNAMIC_READ);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		glBindVertexArray(m_vao[0]);
		glVertexAttribIFormat(1, 4, GL_INT, 0);
		glEnableVertexAttribArray(1);
		glBindVertexBuffer(1, m_buffer[0], 0, 16);
		glBindVertexArray(m_vao[1]);
		glVertexAttribIFormat(1, 4, GL_INT, 0);
		glEnableVertexAttribArray(1);
		glBindVertexBuffer(1, m_buffer[1], 0, 16);
		glBindVertexArray(0);

		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[0]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[1]);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[1]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[0]);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_po);

		for (int i = 0; i < 10; ++i)
		{
			glBindVertexArray(m_vao[i % 2]);
			glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[i % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		{
			IVec4 data;
			glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffer[0]);
			glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 16, &data[0]);
			if (!IsEqual(data, IVec4(10)))
			{
				Output("Data is: %d %d %d %d, data should be: 10 10 10 10.\n", data[0], data[1], data[2], data[3]);
				return ERROR;
			}
		}

		if (!RelinkProgram(5))
			return ERROR;

		glBindVertexArray(m_vao[0]);
		glDisableVertexAttribArray(1);
		glBindVertexBuffer(1, 0, 0, 0);
		glVertexAttribIFormat(5, 4, GL_INT, 0);
		glEnableVertexAttribArray(5);
		glBindVertexBuffer(5, m_buffer[0], 0, 16);
		glBindVertexArray(m_vao[1]);
		glDisableVertexAttribArray(1);
		glBindVertexBuffer(1, 0, 0, 0);
		glVertexAttribIFormat(5, 4, GL_INT, 0);
		glEnableVertexAttribArray(5);
		glBindVertexBuffer(7, m_buffer[1], 0, 16);
		glVertexAttribBinding(5, 7);
		glBindVertexArray(0);

		for (int i = 0; i < 10; ++i)
		{
			glBindVertexArray(m_vao[i % 2]);
			glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[i % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		{
			IVec4 data;
			glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffer[0]);
			glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 16, &data[0]);
			if (!IsEqual(data, IVec4(20)))
			{
				Output("Data is: %d %d %d %d, data should be: 20 20 20 20.\n", data[0], data[1], data[2], data[3]);
				return ERROR;
			}
		}

		if (!RelinkProgram(11))
			return ERROR;
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		glBindVertexArray(m_vao[0]);
		glDisableVertexAttribArray(5);
		glBindVertexBuffer(5, 0, 0, 0);
		glVertexAttribIFormat(11, 4, GL_INT, 0);
		glEnableVertexAttribArray(11);
		for (int i = 0; i < 10; ++i)
		{
			glBindVertexBuffer(11, m_buffer[i % 2], 0, 16);
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[(i + 1) % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		{
			IVec4 data;
			glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffer[0]);
			glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 16, &data[0]);
			if (!IsEqual(data, IVec4(30)))
			{
				Output("Data is: %d %d %d %d, data should be: 30 30 30 30.\n", data[0], data[1], data[2], data[3]);
				return ERROR;
			}
		}

		return NO_ERROR;
	}